

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.h
# Opt level: O0

vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> * __thiscall
yyml::nn::NN::Parameters
          (vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
           *__return_storage_ptr__,NN *this)

{
  bool bVar1;
  reference ppVar2;
  iterator __first;
  iterator __last;
  __normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
  local_a0;
  const_iterator local_98;
  undefined1 local_90 [8];
  vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> layer_params;
  LayerInterface *layer;
  undefined1 local_60 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>
  name_and_layer_pair;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>_>_>
  *__range2;
  NN *this_local;
  vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> *parameters;
  
  std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>::vector
            (__return_storage_ptr__);
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>_>_>
           ::begin(&this->layers_);
  name_and_layer_pair.second =
       (LayerInterface *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>_>_>
       ::end(&this->layers_);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>,_true>
                              *)&name_and_layer_pair.second), bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>,_false,_true>
             ::operator*(&__end2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>
            *)local_60,ppVar2);
    layer_params.
    super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)name_and_layer_pair.first.field_2._8_8_;
    (**(code **)(*(long *)name_and_layer_pair.first.field_2._8_8_ + 8))(local_90);
    local_a0._M_current =
         (Variable<double> **)
         std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>::
         end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<yyml::nn::Variable<double>*const*,std::vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>>>
    ::__normal_iterator<yyml::nn::Variable<double>**>
              ((__normal_iterator<yyml::nn::Variable<double>*const*,std::vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>>>
                *)&local_98,&local_a0);
    __first = std::
              vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>::
              begin((vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                     *)local_90);
    __last = std::
             vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>::
             end((vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                  *)local_90);
    std::vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>>::
    insert<__gnu_cxx::__normal_iterator<yyml::nn::Variable<double>**,std::vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>>>,void>
              ((vector<yyml::nn::Variable<double>*,std::allocator<yyml::nn::Variable<double>*>> *)
               __return_storage_ptr__,local_98,
               (__normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
                )__first._M_current,
               (__normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
                )__last._M_current);
    std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>::
    ~vector((vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> *)
            local_90);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>
             *)local_60);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>,_false,_true>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Variable<double>*> Parameters() {
    std::vector<Variable<double>*> parameters;
    for (auto name_and_layer_pair : layers_) {
      auto* layer = name_and_layer_pair.second;
      auto layer_params = layer->Parameters();
      parameters.insert(parameters.end(), layer_params.begin(),
                        layer_params.end());
    }
    return parameters;
  }